

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wav_header.cc
# Opt level: O2

bool webrtc::ReadWavHeader
               (ReadableWav *readable,size_t *num_channels,int *sample_rate,WavFormat *format,
               size_t *bytes_per_sample,size_t *num_samples)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar3;
  int16_t ext_size;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  uint32_t local_60;
  WavHeader header;
  
  iVar2 = (**readable->_vptr_ReadableWav)(readable,&header,0x24);
  if ((CONCAT44(extraout_var,iVar2) == 0x24) &&
     (((header.fmt.header.Size == 0x10 ||
       (((header.fmt.header.Size == 0x12 &&
         (iVar2 = (**readable->_vptr_ReadableWav)(readable,&ext_size,2),
         CONCAT44(extraout_var_01,iVar2) == 2)) && (ext_size == 0)))) &&
      (iVar2 = (**readable->_vptr_ReadableWav)(readable,&header.data,8),
      CONCAT44(extraout_var_00,iVar2) == 8)))) {
    *format = (uint)header.fmt.AudioFormat;
    *num_channels = (ulong)header.fmt.NumChannels;
    *sample_rate = header.fmt.SampleRate;
    *bytes_per_sample = (ulong)(header.fmt.BitsPerSample >> 3);
    if (7 < header.fmt.BitsPerSample) {
      local_60 = header.data.header.Size;
      *num_samples = (ulong)header.data.header.Size / (ulong)(header.fmt.BitsPerSample >> 3);
      _ext_size = (pointer)&local_70;
      local_70._M_allocated_capacity._0_4_ = header.riff.header.ID;
      local_78 = 4;
      local_70._M_local_buf[4] = '\0';
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &ext_size,"RIFF");
      std::__cxx11::string::~string((string *)&ext_size);
      if (!bVar1) {
        _ext_size = (pointer)&local_70;
        local_70._M_allocated_capacity._0_4_ = header.riff.Format;
        local_78 = 4;
        local_70._M_local_buf[4] = '\0';
        bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&ext_size,"WAVE");
        std::__cxx11::string::~string((string *)&ext_size);
        if (!bVar1) {
          _ext_size = (pointer)&local_70;
          local_70._M_allocated_capacity._0_4_ = header.fmt.header.ID;
          local_78 = 4;
          local_70._M_local_buf[4] = '\0';
          bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&ext_size,"fmt ");
          std::__cxx11::string::~string((string *)&ext_size);
          if (!bVar1) {
            _ext_size = (pointer)&local_70;
            local_70._M_allocated_capacity._0_4_ = header.data.header.ID;
            local_78 = 4;
            local_70._M_local_buf[4] = '\0';
            bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&ext_size,"data");
            std::__cxx11::string::~string((string *)&ext_size);
            if ((!bVar1) && (local_60 + 0x24 <= header.riff.header.Size)) {
              lVar3 = *bytes_per_sample * *num_channels;
              if (header.fmt.ByteRate != (int)lVar3 * *sample_rate) {
                return false;
              }
              if (header.fmt.BlockAlign != (uint16_t)lVar3) {
                return false;
              }
              bVar1 = CheckWavParameters(*num_channels,*sample_rate,*format,*bytes_per_sample,
                                         *num_samples);
              return bVar1;
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool ReadWavHeader(ReadableWav* readable,
                   size_t* num_channels,
                   int* sample_rate,
                   WavFormat* format,
                   size_t* bytes_per_sample,
                   size_t* num_samples) {
  WavHeader header;
  if (readable->Read(&header, kWavHeaderSize - sizeof(header.data)) !=
      kWavHeaderSize - sizeof(header.data))
    return false;

  const uint32_t fmt_size = ReadLE32(header.fmt.header.Size);
  if (fmt_size != kFmtSubchunkSize) {
    // There is an optional two-byte extension field permitted to be present
    // with PCM, but which must be zero.
    int16_t ext_size;
    if (kFmtSubchunkSize + sizeof(ext_size) != fmt_size)
      return false;
    if (readable->Read(&ext_size, sizeof(ext_size)) != sizeof(ext_size))
      return false;
    if (ext_size != 0)
      return false;
  }
  if (readable->Read(&header.data, sizeof(header.data)) != sizeof(header.data))
    return false;

  // Parse needed fields.
  *format = static_cast<WavFormat>(ReadLE16(header.fmt.AudioFormat));
  *num_channels = ReadLE16(header.fmt.NumChannels);
  *sample_rate = ReadLE32(header.fmt.SampleRate);
  *bytes_per_sample = ReadLE16(header.fmt.BitsPerSample) / 8;
  const size_t bytes_in_payload = ReadLE32(header.data.header.Size);
  if (*bytes_per_sample == 0)
    return false;
  *num_samples = bytes_in_payload / *bytes_per_sample;

  // Sanity check remaining fields.
  if (ReadFourCC(header.riff.header.ID) != "RIFF")
    return false;
  if (ReadFourCC(header.riff.Format) != "WAVE")
    return false;
  if (ReadFourCC(header.fmt.header.ID) != "fmt ")
    return false;
  if (ReadFourCC(header.data.header.ID) != "data")
    return false;

  if (ReadLE32(header.riff.header.Size) < RiffChunkSize(bytes_in_payload))
    return false;
  if (ReadLE32(header.fmt.ByteRate) !=
      ByteRate(*num_channels, *sample_rate, *bytes_per_sample))
    return false;
  if (ReadLE16(header.fmt.BlockAlign) !=
      BlockAlign(*num_channels, *bytes_per_sample))
    return false;

  return CheckWavParameters(*num_channels, *sample_rate, *format,
                            *bytes_per_sample, *num_samples);
}